

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTree.hpp
# Opt level: O2

void __thiscall BSTree<int>::destroy(BSTree<int> *this,BSTNode<int> **tree)

{
  BSTNode<int> *pBVar1;
  BSTNode<int> *pBVar2;
  BSTNode<int> **ppBVar3;
  
  pBVar1 = *tree;
  do {
    do {
      ppBVar3 = tree;
      pBVar2 = pBVar1;
      if (pBVar2 == (BSTNode<int> *)0x0) {
        return;
      }
      pBVar1 = pBVar2->left;
      tree = &pBVar2->left;
    } while (pBVar2->left != (BSTNode<int> *)0x0);
    pBVar1 = pBVar2->right;
    tree = &pBVar2->right;
  } while (pBVar2->right != (BSTNode<int> *)0x0);
  operator_delete(pBVar2,0x20);
  *ppBVar3 = (BSTNode<int> *)0x0;
  return;
}

Assistant:

void BSTree<T>::destroy(BSTNode<T>* &tree)
{
	if (tree == nullptr)
		return;

	if (tree->left != nullptr)
		return destroy(tree->left);

	if (tree->right != nullptr)
		return destroy(tree->right);

	delete tree;

	tree = nullptr;
}